

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O0

DefaultNamerDisposer *
ApprovalTests::TemplatedCustomNamer::useAsDefaultNamer(string *templateString)

{
  string *in_RSI;
  DefaultNamerDisposer *in_RDI;
  string *this;
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *in_stack_ffffffffffffffa0;
  string local_50 [24];
  NamerCreator *in_stack_ffffffffffffffc8;
  
  this = local_50;
  ::std::__cxx11::string::string(this,in_RSI);
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>()>::
  function<ApprovalTests::TemplatedCustomNamer::useAsDefaultNamer(std::__cxx11::string)::__0,void>
            (in_stack_ffffffffffffffa0,(anon_class_32_1_cdd0b769 *)this);
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
  useAsDefaultNamer(in_stack_ffffffffffffffc8);
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::~function
            ((function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)0x14b604);
  useAsDefaultNamer(std::__cxx11::string)::$_0::~__0((anon_class_32_1_cdd0b769 *)0x14b60e);
  return in_RDI;
}

Assistant:

DefaultNamerDisposer
    TemplatedCustomNamer::useAsDefaultNamer(std::string templateString)
    {
        return Approvals::useAsDefaultNamer([=]() { return create(templateString); });
    }